

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void send_tree(deflate_state *s,ct_data *tree,int max_code)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  
  uVar1 = (tree->dl).dad;
  uVar12 = (uint)uVar1;
  uVar3 = 7;
  if (uVar1 == 0) {
    uVar3 = 0x8a;
  }
  iVar7 = (uVar1 != 0) + 3;
  uVar9 = s->bi_valid;
  uVar16 = s->bi_buf;
  lVar13 = 0;
  uVar10 = 0xffffffff;
  do {
    lVar15 = 0;
    do {
      uVar11 = uVar12;
      lVar14 = lVar15;
      if ((long)max_code < lVar13 + lVar14) {
        s->bi_buf = uVar16;
        s->bi_valid = uVar9;
        return;
      }
      uVar1 = tree[lVar13 + lVar14 + 1].dl.dad;
      uVar12 = (uint)uVar1;
      lVar15 = lVar14 + 1;
      uVar8 = (uint)lVar15;
    } while (((int)uVar8 < (int)uVar3) && (uVar11 == uVar12));
    uVar3 = (uint)lVar14;
    if ((int)uVar8 < iVar7) {
      uVar3 = ~uVar3;
      uVar6 = uVar16;
      do {
        uVar2 = s->bl_tree[uVar11].fc.freq;
        uVar16 = (ulong)uVar2;
        uVar8 = (uint)s->bl_tree[uVar11].dl.dad;
        uVar10 = uVar9 + uVar8;
        bVar4 = (byte)uVar9;
        if ((uVar10 | uVar9) < 0x40) {
          uVar16 = uVar16 << (bVar4 & 0x3f) | uVar6;
          uVar9 = uVar10;
        }
        else if (uVar9 < 0x40) {
          *(ulong *)(s->pending_buf + s->pending) = uVar16 << (bVar4 & 0x3f) | uVar6;
          s->pending = s->pending + 8;
          uVar16 = (ulong)(uVar2 >> (-bVar4 & 0x3f));
          uVar9 = uVar10 - 0x40;
        }
        else {
          *(ulong *)(s->pending_buf + s->pending) = uVar6;
          s->pending = s->pending + 8;
          uVar9 = uVar8;
        }
        uVar3 = uVar3 + 1;
        uVar6 = uVar16;
      } while (uVar3 != 0);
    }
    else {
      bVar4 = (byte)uVar9;
      if (uVar11 == 0) {
        if (uVar3 < 10) {
          uVar2 = s->bl_tree[0x11].fc.freq;
          uVar6 = (ulong)uVar2;
          uVar10 = (uint)s->bl_tree[0x11].dl.dad;
          uVar3 = uVar9 + uVar10;
          if ((uVar3 | uVar9) < 0x40) {
            uVar6 = uVar6 << (bVar4 & 0x3f) | uVar16;
            uVar10 = uVar3;
          }
          else if (uVar9 < 0x40) {
            *(ulong *)(s->pending_buf + s->pending) = uVar6 << (bVar4 & 0x3f) | uVar16;
            s->pending = s->pending + 8;
            uVar6 = (ulong)(uVar2 >> (-bVar4 & 0x3f));
            uVar10 = uVar3 - 0x40;
          }
          else {
            *(ulong *)(s->pending_buf + s->pending) = uVar16;
            s->pending = s->pending + 8;
          }
          uVar16 = lVar14 - 2;
          uVar9 = uVar10 + 3;
          if ((uVar9 | uVar10) < 0x40) {
LAB_0010bb9c:
            uVar16 = uVar16 << ((byte)uVar10 & 0x3f) | uVar6;
          }
          else if (uVar10 < 0x40) {
            *(ulong *)(s->pending_buf + s->pending) = uVar16 << ((byte)uVar10 & 0x3f) | uVar6;
            s->pending = s->pending + 8;
            uVar16 = uVar16 >> (-(byte)uVar10 & 0x3f);
            uVar9 = uVar10 - 0x3d;
          }
          else {
            *(ulong *)(s->pending_buf + s->pending) = uVar6;
            s->pending = s->pending + 8;
            uVar9 = 3;
          }
        }
        else {
          uVar2 = s->bl_tree[0x12].fc.freq;
          uVar6 = (ulong)uVar2;
          uVar10 = (uint)s->bl_tree[0x12].dl.dad;
          uVar3 = uVar9 + uVar10;
          if ((uVar3 | uVar9) < 0x40) {
            uVar6 = uVar6 << (bVar4 & 0x3f) | uVar16;
            uVar10 = uVar3;
          }
          else if (uVar9 < 0x40) {
            *(ulong *)(s->pending_buf + s->pending) = uVar6 << (bVar4 & 0x3f) | uVar16;
            s->pending = s->pending + 8;
            uVar6 = (ulong)(uVar2 >> (-bVar4 & 0x3f));
            uVar10 = uVar3 - 0x40;
          }
          else {
            *(ulong *)(s->pending_buf + s->pending) = uVar16;
            s->pending = s->pending + 8;
          }
          uVar16 = lVar14 - 10;
          uVar9 = uVar10 + 7;
          if ((uVar9 | uVar10) < 0x40) goto LAB_0010bb9c;
          if (uVar10 < 0x40) {
            *(ulong *)(s->pending_buf + s->pending) = uVar16 << ((byte)uVar10 & 0x3f) | uVar6;
            s->pending = s->pending + 8;
            uVar16 = uVar16 >> (-(byte)uVar10 & 0x3f);
            uVar9 = uVar10 - 0x39;
          }
          else {
            *(ulong *)(s->pending_buf + s->pending) = uVar6;
            s->pending = s->pending + 8;
            uVar9 = 7;
          }
        }
      }
      else {
        if (uVar11 != uVar10) {
          uVar2 = s->bl_tree[uVar11].fc.freq;
          uVar6 = (ulong)uVar2;
          uVar5 = (uint)s->bl_tree[uVar11].dl.dad;
          uVar10 = uVar9 + uVar5;
          uVar8 = uVar3;
          if ((uVar10 | uVar9) < 0x40) {
            uVar16 = uVar16 | uVar6 << (bVar4 & 0x3f);
            uVar9 = uVar10;
          }
          else if (uVar9 < 0x40) {
            *(ulong *)(s->pending_buf + s->pending) = uVar6 << (bVar4 & 0x3f) | uVar16;
            s->pending = s->pending + 8;
            uVar16 = (ulong)(uVar2 >> (-bVar4 & 0x3f));
            uVar9 = uVar10 - 0x40;
          }
          else {
            *(ulong *)(s->pending_buf + s->pending) = uVar16;
            s->pending = s->pending + 8;
            uVar16 = uVar6;
            uVar9 = uVar5;
          }
        }
        uVar2 = s->bl_tree[0x10].fc.freq;
        uVar6 = (ulong)uVar2;
        uVar10 = (uint)s->bl_tree[0x10].dl.dad;
        uVar3 = uVar9 + uVar10;
        bVar4 = (byte)uVar9;
        if ((uVar3 | uVar9) < 0x40) {
          uVar6 = uVar6 << (bVar4 & 0x3f) | uVar16;
          uVar10 = uVar3;
        }
        else if (uVar9 < 0x40) {
          *(ulong *)(s->pending_buf + s->pending) = uVar6 << (bVar4 & 0x3f) | uVar16;
          s->pending = s->pending + 8;
          uVar6 = (ulong)(uVar2 >> (-bVar4 & 0x3f));
          uVar10 = uVar3 - 0x40;
        }
        else {
          *(ulong *)(s->pending_buf + s->pending) = uVar16;
          s->pending = s->pending + 8;
        }
        uVar16 = (long)(int)uVar8 - 3;
        uVar9 = uVar10 + 2;
        if ((uVar9 | uVar10) < 0x40) goto LAB_0010bb9c;
        if (uVar10 < 0x40) {
          *(ulong *)(s->pending_buf + s->pending) = uVar16 << ((byte)uVar10 & 0x3f) | uVar6;
          s->pending = s->pending + 8;
          uVar16 = uVar16 >> (-(byte)uVar10 & 0x3f);
          uVar9 = uVar10 - 0x3e;
        }
        else {
          *(ulong *)(s->pending_buf + s->pending) = uVar6;
          s->pending = s->pending + 8;
          uVar9 = 2;
        }
      }
    }
    lVar13 = lVar13 + lVar15;
    iVar7 = 4 - (uint)(uVar11 == uVar12);
    uVar3 = uVar11 == uVar12 ^ 7;
    uVar10 = uVar11;
    if (uVar1 == 0) {
      iVar7 = 3;
      uVar3 = 0x8a;
    }
  } while( true );
}

Assistant:

static void send_tree(deflate_state *s, ct_data *tree, int max_code) {
    /* tree: the tree to be scanned */
    /* max_code and its largest code of non zero frequency */
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0)
        max_count = 138, min_count = 3;

    // Temp local variables
    uint32_t bi_valid = s->bi_valid;
    uint64_t bi_buf = s->bi_buf;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen;
        nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do {
                send_code(s, curlen, s->bl_tree, bi_buf, bi_valid);
            } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(s, curlen, s->bl_tree, bi_buf, bi_valid);
                count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(s, REP_3_6, s->bl_tree, bi_buf, bi_valid);
            send_bits(s, count-3, 2, bi_buf, bi_valid);

        } else if (count <= 10) {
            send_code(s, REPZ_3_10, s->bl_tree, bi_buf, bi_valid);
            send_bits(s, count-3, 3, bi_buf, bi_valid);

        } else {
            send_code(s, REPZ_11_138, s->bl_tree, bi_buf, bi_valid);
            send_bits(s, count-11, 7, bi_buf, bi_valid);
        }
        count = 0;
        prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }

    // Store back temp variables
    s->bi_buf = bi_buf;
    s->bi_valid = bi_valid;
}